

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O2

uint32_t cab_checksum_cfdata(void *p,size_t bytes,uint32_t seed)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  
  uVar2 = cab_checksum_cfdata_4(p,bytes,seed);
  pbVar5 = (byte *)((bytes & 0xfffffffffffffffc) + (long)p);
  uVar4 = 0;
  uVar3 = 0;
  switch((uint)bytes & 3) {
  case 3:
    bVar1 = *pbVar5;
    pbVar5 = pbVar5 + 1;
    uVar3 = (uint)bVar1 << 0x10;
  case 2:
    bVar1 = *pbVar5;
    pbVar5 = pbVar5 + 1;
    uVar4 = uVar3 | (uint)bVar1 << 8;
  case 1:
    uVar4 = uVar4 | *pbVar5;
  case 0:
    return uVar4 ^ uVar2;
  }
}

Assistant:

static uint32_t
cab_checksum_cfdata(const void *p, size_t bytes, uint32_t seed)
{
	const unsigned char *b;
	uint32_t sum;
	uint32_t t;

	sum = cab_checksum_cfdata_4(p, bytes, seed);
	b = p;
	b += bytes & ~3;
	t = 0;
	switch (bytes & 3) {
	case 3:
		t |= ((uint32_t)(*b++)) << 16;
		/* FALL THROUGH */
	case 2:
		t |= ((uint32_t)(*b++)) << 8;
		/* FALL THROUGH */
	case 1:
		t |= *b;
		/* FALL THROUGH */
	default:
		break;
	}
	sum ^= t;

	return (sum);
}